

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softhsm2-util.cpp
# Opt level: O3

int initToken(CK_SLOT_ID slotID,char *label,char *soPIN,char *userPIN)

{
  CK_C_InitToken p_Var1;
  CK_C_Login p_Var2;
  CK_C_InitPIN p_Var3;
  CK_SESSION_HANDLE CVar4;
  int iVar5;
  size_t sVar6;
  CK_RV CVar7;
  long lVar8;
  _CK_TOKEN_INFO *p_Var9;
  undefined8 *puVar10;
  char *pcVar11;
  byte bVar12;
  CK_SESSION_HANDLE hSession;
  CK_SLOT_ID newSlotID;
  CK_UTF8CHAR paddedLabel [32];
  char so_pin_copy [256];
  CK_TOKEN_INFO tokenInfo;
  char user_pin_copy [256];
  CK_TOKEN_INFO in_stack_fffffffffffffc08;
  CK_SESSION_HANDLE local_328;
  CK_SLOT_ID local_320 [5];
  undefined1 local_2f8 [256];
  _CK_TOKEN_INFO local_1f8;
  uchar local_128 [256];
  
  bVar12 = 0;
  if (label == (char *)0x0) {
    initToken();
  }
  else {
    sVar6 = strlen(label);
    if (sVar6 < 0x21) {
      iVar5 = getPW(soPIN,local_2f8,0);
      if (iVar5 == 0) {
        iVar5 = getPW(userPIN,(char *)local_128,1);
        if (iVar5 == 0) {
          local_320[3] = 0x2020202020202020;
          local_320[4] = 0x2020202020202020;
          local_320[1] = 0x2020202020202020;
          local_320[2] = 0x2020202020202020;
          sVar6 = strlen(label);
          memcpy(local_320 + 1,label,sVar6);
          p_Var1 = p11->C_InitToken;
          sVar6 = strlen(local_2f8);
          CVar7 = (*p_Var1)(slotID,local_2f8,sVar6,(uchar *)(local_320 + 1));
          if (CVar7 == 0) {
            CVar7 = (*p11->C_OpenSession)(slotID,6,(void *)0x0,(CK_NOTIFY)0x0,&local_328);
            CVar4 = local_328;
            if (CVar7 != 0) {
              initToken();
              return 1;
            }
            p_Var2 = p11->C_Login;
            sVar6 = strlen(local_2f8);
            CVar7 = (*p_Var2)(CVar4,0,local_2f8,sVar6);
            if (CVar7 != 0) {
              initToken();
              return 1;
            }
            p_Var3 = p11->C_InitPIN;
            sVar6 = strlen((char *)local_128);
            CVar7 = (*p_Var3)(local_328,local_128,sVar6);
            if (CVar7 != 0) {
              initToken();
              return 1;
            }
            CVar7 = (*p11->C_GetTokenInfo)(slotID,&local_1f8);
            if (CVar7 == 0) {
              (*p11->C_Finalize)((void *)0x0);
              CVar7 = (*p11->C_Initialize)((void *)0x0);
              if (CVar7 != 0) {
                initToken();
                return 1;
              }
              p_Var9 = &local_1f8;
              puVar10 = (undefined8 *)&stack0xfffffffffffffc08;
              for (lVar8 = 0x1a; lVar8 != 0; lVar8 = lVar8 + -1) {
                *puVar10 = *(undefined8 *)p_Var9->label;
                p_Var9 = (_CK_TOKEN_INFO *)((long)p_Var9 + ((ulong)bVar12 * -2 + 1) * 8);
                puVar10 = puVar10 + (ulong)bVar12 * -2 + 1;
              }
              iVar5 = findSlot(in_stack_fffffffffffffc08,local_320);
              if (iVar5 == 0) {
                if (local_320[0] == slotID) {
                  pcVar11 = "The token has been initialized on slot %lu\n";
                }
                else {
                  pcVar11 = "The token has been initialized and is reassigned to slot %lu\n";
                  slotID = local_320[0];
                }
                printf(pcVar11,slotID);
                return 0;
              }
              return 1;
            }
            pcVar11 = "ERROR: Could not get info about the initialized token in slot %lu.\n";
          }
          else {
            if (CVar7 == 0xe0) {
              initToken();
              return 1;
            }
            if (CVar7 == 0xa0) {
              initToken();
              return 1;
            }
            if (CVar7 != 3) {
              initToken();
              return 1;
            }
            pcVar11 = "CKR_SLOT_ID_INVALID: Slot %lu does not exist.\n";
          }
          fprintf(_stderr,pcVar11,slotID);
        }
        else {
          initToken();
        }
      }
      else {
        initToken();
      }
    }
    else {
      initToken();
    }
  }
  return 1;
}

Assistant:

int initToken(CK_SLOT_ID slotID, char* label, char* soPIN, char* userPIN)
{
	char so_pin_copy[MAX_PIN_LEN+1];
	char user_pin_copy[MAX_PIN_LEN+1];

	if (label == NULL)
	{
		fprintf(stderr, "ERROR: A label for the token must be supplied. "
				"Use --label <text>\n");
		return 1;
	}

	if (strlen(label) > 32)
	{
		fprintf(stderr, "ERROR: The token label must not have a length "
				"greater than 32 chars.\n");
		return 1;
	}

	// Get the passwords
	if (getPW(soPIN, so_pin_copy, CKU_SO) != 0)
	{
		fprintf(stderr, "ERROR: Could not get SO PIN\n");
		return 1;
	}
	if (getPW(userPIN, user_pin_copy, CKU_USER) != 0)
	{
		fprintf(stderr, "ERROR: Could not get user PIN\n");
		return 1;
	}

	// Load the variables
	CK_UTF8CHAR paddedLabel[32];
	memset(paddedLabel, ' ', sizeof(paddedLabel));
	memcpy(paddedLabel, label, strlen(label));

	CK_RV rv = p11->C_InitToken(slotID, (CK_UTF8CHAR_PTR)so_pin_copy, strlen(so_pin_copy), paddedLabel);

	switch (rv)
	{
		case CKR_OK:
			break;
		case CKR_SLOT_ID_INVALID:
			fprintf(stderr, "CKR_SLOT_ID_INVALID: Slot %lu does not exist.\n", slotID);
			return 1;
			break;
		case CKR_PIN_INCORRECT:
			fprintf(stderr, "CKR_PIN_INCORRECT: The given SO PIN does not match the "
					"one in the token. Needed when reinitializing the token.\n");
			return 1;
			break;
		case CKR_TOKEN_NOT_PRESENT:
			fprintf(stderr, "CKR_TOKEN_NOT_PRESENT: The token is not present. "
					"Please read the HSM manual for further assistance.\n");
			return 1;
			break;
		default:
			fprintf(stderr, "ERROR rv=0x%08X: Could not initialize the token.\n", (unsigned int)rv);
			fprintf(stderr, "Please check log files for additional information.\n");
			return 1;
			break;
	}

	CK_SESSION_HANDLE hSession;
	rv = p11->C_OpenSession(slotID, CKF_SERIAL_SESSION | CKF_RW_SESSION, NULL_PTR, NULL_PTR, &hSession);
	if (rv != CKR_OK)
	{
		fprintf(stderr, "ERROR: Could not open a session with the library.\n");
		return 1;
	}

	rv = p11->C_Login(hSession, CKU_SO, (CK_UTF8CHAR_PTR)so_pin_copy, strlen(so_pin_copy));
	if (rv != CKR_OK)
	{
		fprintf(stderr, "ERROR: Could not log in on the token.\n");
		return 1;
	}

	rv = p11->C_InitPIN(hSession, (CK_UTF8CHAR_PTR)user_pin_copy, strlen(user_pin_copy));
	if (rv != CKR_OK)
	{
		fprintf(stderr, "ERROR: Could not initialize the user PIN.\n");
		return 1;
	}

	// Get the token info
	CK_TOKEN_INFO tokenInfo;
	rv = p11->C_GetTokenInfo(slotID, &tokenInfo);
	if (rv != CKR_OK)
	{
		fprintf(stderr, "ERROR: Could not get info about the initialized token in slot %lu.\n", slotID);
		return 1;
	}

	// Reload the library
	p11->C_Finalize(NULL_PTR);
	rv = p11->C_Initialize(NULL_PTR);
	if (rv != CKR_OK)
	{
		fprintf(stderr, "ERROR: Could not initialize the library.\n");
		return 1;
	}

	// Get the slotID
	CK_SLOT_ID newSlotID;
	if (findSlot(tokenInfo, newSlotID))
	{
		return 1;
	}

	if (slotID == newSlotID)
	{
		printf("The token has been initialized on slot %lu\n", newSlotID);
	}
	else
	{
		printf("The token has been initialized and is reassigned to slot %lu\n", newSlotID);
	}

	return 0;
}